

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# throw_exception.hpp
# Opt level: O2

void boost::throw_exception<boost::asio::service_already_exists>(service_already_exists *e)

{
  clone_impl<boost::exception_detail::error_info_injector<boost::asio::service_already_exists>_>
  *this;
  error_info_injector<boost::asio::service_already_exists> local_50;
  
  this = (clone_impl<boost::exception_detail::error_info_injector<boost::asio::service_already_exists>_>
          *)__cxa_allocate_exception(0x40);
  exception_detail::error_info_injector<boost::asio::service_already_exists>::error_info_injector
            (&local_50,e);
  exception_detail::
  clone_impl<boost::exception_detail::error_info_injector<boost::asio::service_already_exists>_>::
  clone_impl(this,&local_50);
  __cxa_throw(this,&exception_detail::
                    clone_impl<boost::exception_detail::error_info_injector<boost::asio::service_already_exists>>
                    ::typeinfo,
              exception_detail::
              clone_impl<boost::exception_detail::error_info_injector<boost::asio::service_already_exists>_>
              ::~clone_impl);
}

Assistant:

BOOST_NORETURN inline void throw_exception( E const & e )
{
    //All boost exceptions are required to derive from std::exception,
    //to ensure compatibility with BOOST_NO_EXCEPTIONS.
    throw_exception_assert_compatibility(e);

#ifndef BOOST_EXCEPTION_DISABLE
    throw enable_current_exception(enable_error_info(e));
#else
    throw e;
#endif
}